

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.c
# Opt level: O0

int yaml_parser_register_anchor(yaml_parser_t *parser,int index,yaml_char_t *anchor)

{
  yaml_node_t *pyVar1;
  yaml_alias_data_t *__dest;
  yaml_mark_t problem_mark;
  int iVar2;
  yaml_alias_data_t *local_58;
  yaml_alias_data_t *alias_data;
  yaml_alias_data_t data;
  yaml_char_t *anchor_local;
  int index_local;
  yaml_parser_t *parser_local;
  
  if (anchor == (yaml_char_t *)0x0) {
    parser_local._4_4_ = 1;
  }
  else {
    pyVar1 = (parser->document->nodes).start;
    iVar2 = index + -1;
    data._8_8_ = pyVar1[iVar2].start_mark.index;
    data.mark.index = pyVar1[iVar2].start_mark.line;
    data.mark.line = pyVar1[iVar2].start_mark.column;
    alias_data = (yaml_alias_data_t *)anchor;
    data.anchor._0_4_ = index;
    data.mark.column = (size_t)anchor;
    for (local_58 = (parser->aliases).start; local_58 != (parser->aliases).top;
        local_58 = local_58 + 1) {
      iVar2 = strcmp((char *)local_58->anchor,(char *)data.mark.column);
      if (iVar2 == 0) {
        yaml_free((void *)data.mark.column);
        problem_mark.line = data.mark.index;
        problem_mark.index = data._8_8_;
        problem_mark.column = data.mark.line;
        iVar2 = yaml_parser_set_composer_error_context
                          (parser,"found duplicate anchor; first occurrence",local_58->mark,
                           "second occurrence",problem_mark);
        return iVar2;
      }
    }
    if (((parser->aliases).top == (parser->aliases).end) &&
       (iVar2 = yaml_stack_extend(&(parser->aliases).start,&(parser->aliases).top,
                                  &(parser->aliases).end), iVar2 == 0)) {
      parser->error = YAML_MEMORY_ERROR;
      yaml_free((void *)data.mark.column);
      parser_local._4_4_ = 0;
    }
    else {
      __dest = (parser->aliases).top;
      (parser->aliases).top = __dest + 1;
      memcpy(__dest,&alias_data,0x28);
      parser_local._4_4_ = 1;
    }
  }
  return parser_local._4_4_;
}

Assistant:

static int
yaml_parser_register_anchor(yaml_parser_t *parser,
        int index, yaml_char_t *anchor)
{
    yaml_alias_data_t data;
    yaml_alias_data_t *alias_data;

    if (!anchor) return 1;

    data.anchor = anchor;
    data.index = index;
    data.mark = parser->document->nodes.start[index-1].start_mark;

    for (alias_data = parser->aliases.start;
            alias_data != parser->aliases.top; alias_data ++) {
        if (strcmp((char *)alias_data->anchor, (char *)anchor) == 0) {
            yaml_free(anchor);
            return yaml_parser_set_composer_error_context(parser,
                    "found duplicate anchor; first occurrence",
                    alias_data->mark, "second occurrence", data.mark);
        }
    }

    if (!PUSH(parser, parser->aliases, data)) {
        yaml_free(anchor);
        return 0;
    }

    return 1;
}